

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

void vkt::rasterization::anon_unknown_0::createRasterizationTests(TestCaseGroup *rasterizationTests)

{
  VkPrimitiveTopology VVar1;
  VkFrontFace VVar2;
  undefined4 uVar3;
  PrimitiveWideness wideness;
  TestContext *pTVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  BaseRenderingTestCase *pBVar7;
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance> *pWVar8;
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LineStripTestInstance> *pWVar9;
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance> *pWVar10;
  FillRuleTestCase *pFVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  TriangleInterpolationTestCase *pTVar15;
  LineInterpolationTestCase *pLVar16;
  ostream *poVar17;
  VkSampleCountFlagBits VVar18;
  PrimitiveWideness sampleCount;
  long lVar19;
  allocator<char> local_261;
  TestContext *local_260;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  TestNode *local_1f8;
  PrimitiveWideness *local_1f0;
  long local_1e8;
  string name;
  
  pTVar4 = (rasterizationTests->super_TestNode).m_testCtx;
  pTVar5 = (TestNode *)operator_new(0x70);
  local_260 = pTVar4;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pTVar4,"primitives","Primitive rasterization");
  tcu::TestNode::addChild(&rasterizationTests->super_TestNode,pTVar5);
  pTVar6 = (TestNode *)operator_new(0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangles",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"
             ,(allocator<char> *)&local_218);
  BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance>::BaseTestCase
            ((BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance> *)
             pTVar6,local_260,&name,&local_258,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar5,pTVar6);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pBVar7 = (BaseRenderingTestCase *)operator_new(0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangle_strip",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, verify rasterization result"
             ,(allocator<char> *)&local_218);
  BaseRenderingTestCase::BaseRenderingTestCase
            (pBVar7,local_260,&name,&local_258,VK_SAMPLE_COUNT_1_BIT,0);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00c098f8;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pBVar7 = (BaseRenderingTestCase *)operator_new(0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangle_fan",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN, verify rasterization result",
             (allocator<char> *)&local_218);
  BaseRenderingTestCase::BaseRenderingTestCase
            (pBVar7,local_260,&name,&local_258,VK_SAMPLE_COUNT_1_BIT,0);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00c099c0;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pWVar8 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance> *)
           operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"lines",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",
             (allocator<char> *)&local_218);
  VVar18 = VK_SAMPLE_COUNT_1_BIT;
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance>::WidenessTestCase
            (pWVar8,local_260,&name,&local_258,PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pWVar8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pWVar9 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LineStripTestInstance> *)
           operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"line_strip",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP, verify rasterization result",
             (allocator<char> *)&local_218);
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LineStripTestInstance>::
  WidenessTestCase(pWVar9,local_260,&name,&local_258,PRIMITIVEWIDENESS_NARROW,VVar18);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pWVar9);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pWVar8 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance> *)
           operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"lines_wide",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result"
             ,(allocator<char> *)&local_218);
  VVar18 = VK_SAMPLE_COUNT_1_BIT;
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance>::WidenessTestCase
            (pWVar8,local_260,&name,&local_258,PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pWVar8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pWVar9 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LineStripTestInstance> *)
           operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"line_strip_wide",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP with wide lines, verify rasterization result"
             ,(allocator<char> *)&local_218);
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LineStripTestInstance>::
  WidenessTestCase(pWVar9,local_260,&name,&local_258,PRIMITIVEWIDENESS_WIDE,VVar18);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pWVar9);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pWVar10 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance> *)
            operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"points",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",
             (allocator<char> *)&local_218);
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance>::WidenessTestCase
            (pWVar10,local_260,&name,&local_258,PRIMITIVEWIDENESS_WIDE,VVar18);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pWVar10);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_260,"fill_rules","Primitive fill rules");
  tcu::TestNode::addChild(&rasterizationTests->super_TestNode,pTVar5);
  pFVar11 = (FillRuleTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"basic_quad",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify fill rules",(allocator<char> *)&local_218);
  FillRuleTestCase::FillRuleTestCase
            (pFVar11,local_260,&name,&local_258,FILLRULECASE_BASIC,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar11);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pFVar11 = (FillRuleTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"basic_quad_reverse",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify fill rules",(allocator<char> *)&local_218);
  FillRuleTestCase::FillRuleTestCase
            (pFVar11,local_260,&name,&local_258,FILLRULECASE_REVERSED,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar11);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pFVar11 = (FillRuleTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"clipped_full",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify fill rules",(allocator<char> *)&local_218);
  FillRuleTestCase::FillRuleTestCase
            (pFVar11,local_260,&name,&local_258,FILLRULECASE_CLIPPED_FULL,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar11);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pFVar11 = (FillRuleTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"clipped_partly",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify fill rules",(allocator<char> *)&local_218);
  FillRuleTestCase::FillRuleTestCase
            (pFVar11,local_260,&name,&local_258,FILLRULECASE_CLIPPED_PARTIAL,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar11);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pFVar11 = (FillRuleTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"projected",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify fill rules",(allocator<char> *)&local_218);
  FillRuleTestCase::FillRuleTestCase
            (pFVar11,local_260,&name,&local_258,FILLRULECASE_PROJECTED,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar11);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,local_260,"culling","Culling");
  tcu::TestNode::addChild(&rasterizationTests->super_TestNode,pTVar5);
  lVar14 = 0;
  local_1f8 = &rasterizationTests->super_TestNode;
  for (; lVar14 != 3; lVar14 = lVar14 + 1) {
    local_1f0 = (PrimitiveWideness *)
                CONCAT44(local_1f0._4_4_,createRasterizationTests::cullModes[lVar14].mode);
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
        lVar19 = 0;
        while( true ) {
          if (lVar19 == 0x30) break;
          if (((int)local_1f0 != 3) ||
             (*(int *)((long)&createRasterizationTests::polygonModes[0].mode + lVar19) == 0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_218,createRasterizationTests::cullModes[lVar14].prefix,
                       &local_261);
            std::operator+(&local_238,&local_218,
                           createRasterizationTests::primitiveTypes[lVar13].name);
            std::operator+(&local_258,&local_238,
                           createRasterizationTests::frontOrders[lVar12].postfix);
            std::operator+(&name,&local_258,
                           *(char **)((long)&createRasterizationTests::polygonModes[0].name + lVar19
                                     ));
            local_1e8 = lVar19;
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string((string *)&local_218);
            pBVar7 = (BaseRenderingTestCase *)operator_new(0x88);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_258,"Test primitive culling.",(allocator<char> *)&local_238)
            ;
            VVar1 = createRasterizationTests::primitiveTypes[lVar13].type;
            VVar2 = createRasterizationTests::frontOrders[lVar12].mode;
            uVar3 = *(undefined4 *)
                     ((long)&createRasterizationTests::polygonModes[0].mode + local_1e8);
            BaseRenderingTestCase::BaseRenderingTestCase
                      (pBVar7,local_260,&name,&local_258,VK_SAMPLE_COUNT_1_BIT,0);
            (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__TestCase_00c09e40;
            *(int *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
                 (int)local_1f0;
            *(VkPrimitiveTopology *)
             ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
                 VVar1;
            *(VkFrontFace *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
                 VVar2;
            *(undefined4 *)
             ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = uVar3;
            tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&name);
            lVar19 = local_1e8;
          }
          lVar19 = lVar19 + 0x10;
        }
        rasterizationTests = (TestCaseGroup *)local_1f8;
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  pTVar4 = local_260;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_260,"interpolation","Test interpolation");
  tcu::TestNode::addChild(&rasterizationTests->super_TestNode,pTVar5);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar4,"basic","Non-projective interpolation");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar15 = (TriangleInterpolationTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangles",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify triangle interpolation",(allocator<char> *)&local_218);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar15,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0,
             VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar15);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pTVar15 = (TriangleInterpolationTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangle_strip",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify triangle strip interpolation",
             (allocator<char> *)&local_218);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar15,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,0,
             VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar15);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pTVar15 = (TriangleInterpolationTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangle_fan",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify triangle fan interpolation",(allocator<char> *)&local_218)
  ;
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar15,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,0,
             VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar15);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"lines",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify line interpolation",(allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,0,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"line_strip",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify line strip interpolation",(allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,0,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"lines_wide",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify wide line interpolation",(allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,0,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"line_strip_wide",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify wide line strip interpolation",
             (allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,0,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_260,"projected","Projective interpolation");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar15 = (TriangleInterpolationTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangles",(allocator<char> *)&local_238);
  pTVar5 = local_1f8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify triangle interpolation",(allocator<char> *)&local_218);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar15,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,2,
             VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar15);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pTVar15 = (TriangleInterpolationTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangle_strip",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify triangle strip interpolation",
             (allocator<char> *)&local_218);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar15,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,2,
             VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar15);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pTVar15 = (TriangleInterpolationTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangle_fan",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify triangle fan interpolation",(allocator<char> *)&local_218)
  ;
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar15,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,2,
             VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar15);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"lines",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify line interpolation",(allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,2,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"line_strip",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify line strip interpolation",(allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,2,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"lines_wide",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify wide line interpolation",(allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,2,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"line_strip_wide",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify wide line strip interpolation",
             (allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,2,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_260,"flatshading","Test flatshading");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar15 = (TriangleInterpolationTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangles",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify triangle flatshading",(allocator<char> *)&local_218);
  pTVar4 = local_260;
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar15,local_260,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,4,
             VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar15);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pTVar15 = (TriangleInterpolationTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangle_strip",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify triangle strip flatshading",(allocator<char> *)&local_218)
  ;
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar15,pTVar4,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,4,
             VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar15);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pTVar15 = (TriangleInterpolationTestCase *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"triangle_fan",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify triangle fan flatshading",(allocator<char> *)&local_218);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar15,pTVar4,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,4,
             VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar15);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"lines",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify line flatshading",(allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,pTVar4,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,4,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"line_strip",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify line strip flatshading",(allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,pTVar4,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,4,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"lines_wide",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify wide line flatshading",(allocator<char> *)&local_218);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,pTVar4,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,4,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"line_strip_wide",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Verify wide line strip flatshading",(allocator<char> *)&local_218
            );
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar16,pTVar4,&name,&local_258,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,4,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar16);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&name);
  local_1f0 = &DAT_009ea520;
  for (local_1e8 = 0; local_1e8 != 6; local_1e8 = local_1e8 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    poVar17 = std::operator<<((ostream *)&name,"_multisample_");
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,2 << ((byte)local_1e8 & 0x1f));
    std::operator<<(poVar17,"_bit");
    pTVar5 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_258,"primitives",&local_238);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,local_260,local_258._M_dataplus._M_p,
               "Primitive rasterization");
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    tcu::TestNode::addChild(local_1f8,pTVar5);
    pTVar6 = (TestNode *)operator_new(0x78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"triangles",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"
               ,&local_261);
    wideness = *local_1f0;
    BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance>::BaseTestCase
              ((BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance> *)
               pTVar6,local_260,&local_258,&local_238,wideness);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pWVar8 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance> *)
             operator_new(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"lines",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",
               &local_261);
    WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance>::WidenessTestCase
              (pWVar8,local_260,&local_258,&local_238,PRIMITIVEWIDENESS_NARROW,wideness);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pWVar8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pWVar8 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance> *)
             operator_new(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"lines_wide",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result"
               ,&local_261);
    sampleCount = wideness;
    WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance>::WidenessTestCase
              (pWVar8,local_260,&local_258,&local_238,PRIMITIVEWIDENESS_WIDE,wideness);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pWVar8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pWVar10 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance> *)
              operator_new(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"points",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",
               &local_261);
    WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance>::WidenessTestCase
              (pWVar10,local_260,&local_258,&local_238,wideness,sampleCount);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pWVar10);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pTVar5 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_258,"fill_rules",&local_238);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,local_260,local_258._M_dataplus._M_p,"Primitive fill rules");
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    tcu::TestNode::addChild(local_1f8,pTVar5);
    pFVar11 = (FillRuleTestCase *)operator_new(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"basic_quad",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Verify fill rules",&local_261);
    FillRuleTestCase::FillRuleTestCase
              (pFVar11,local_260,&local_258,&local_238,FILLRULECASE_BASIC,wideness);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar11);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pFVar11 = (FillRuleTestCase *)operator_new(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"basic_quad_reverse",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Verify fill rules",&local_261);
    FillRuleTestCase::FillRuleTestCase
              (pFVar11,local_260,&local_258,&local_238,FILLRULECASE_REVERSED,wideness);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar11);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pFVar11 = (FillRuleTestCase *)operator_new(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"clipped_full",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Verify fill rules",&local_261);
    FillRuleTestCase::FillRuleTestCase
              (pFVar11,local_260,&local_258,&local_238,FILLRULECASE_CLIPPED_FULL,wideness);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar11);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pFVar11 = (FillRuleTestCase *)operator_new(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"clipped_partly",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Verify fill rules",&local_261);
    FillRuleTestCase::FillRuleTestCase
              (pFVar11,local_260,&local_258,&local_238,FILLRULECASE_CLIPPED_PARTIAL,wideness);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar11);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pFVar11 = (FillRuleTestCase *)operator_new(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"projected",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Verify fill rules",&local_261);
    FillRuleTestCase::FillRuleTestCase
              (pFVar11,local_260,&local_258,&local_238,FILLRULECASE_PROJECTED,wideness);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar11);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pTVar5 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_258,"interpolation",&local_238);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,local_260,local_258._M_dataplus._M_p,"Test interpolation");
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    tcu::TestNode::addChild(local_1f8,pTVar5);
    pTVar15 = (TriangleInterpolationTestCase *)operator_new(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"triangles",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Verify triangle interpolation",&local_261);
    TriangleInterpolationTestCase::TriangleInterpolationTestCase
              (pTVar15,local_260,&local_258,&local_238,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0,
               wideness);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar15);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"lines",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Verify line interpolation",&local_261);
    LineInterpolationTestCase::LineInterpolationTestCase
              (pLVar16,local_260,&local_258,&local_238,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,0,
               PRIMITIVEWIDENESS_NARROW,wideness);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar16);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    pLVar16 = (LineInterpolationTestCase *)operator_new(0x88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"lines_wide",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Verify wide line interpolation",&local_261);
    LineInterpolationTestCase::LineInterpolationTestCase
              (pLVar16,local_260,&local_258,&local_238,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,0,
               PRIMITIVEWIDENESS_WIDE,wideness);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar16);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    local_1f0 = local_1f0 + 1;
  }
  return;
}

Assistant:

void createRasterizationTests (tcu::TestCaseGroup* rasterizationTests)
{
	tcu::TestContext&	testCtx		=	rasterizationTests->getTestContext();

	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(testCtx, "primitives", "Primitive rasterization");

		rasterizationTests->addChild(primitives);

		primitives->addChild(new BaseTestCase<TrianglesTestInstance>		(testCtx, "triangles",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"));
		primitives->addChild(new BaseTestCase<TriangleStripTestInstance>	(testCtx, "triangle_strip",		"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new BaseTestCase<TriangleFanTestInstance>		(testCtx, "triangle_fan",		"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new WidenessTestCase<LineStripTestInstance>	(testCtx, "line_strip",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines_wide",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new WidenessTestCase<LineStripTestInstance>	(testCtx, "line_strip_wide",	"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new WidenessTestCase<PointTestInstance>		(testCtx, "points",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",						PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(testCtx, "fill_rules", "Primitive fill rules");

		rasterizationTests->addChild(fillRules);

		fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad_reverse",	"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_full",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_partly",		"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"projected",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			VkCullModeFlags	mode;
			const char*		prefix;
		} cullModes[] =
		{
			{ VK_CULL_MODE_FRONT_BIT,				"front_"	},
			{ VK_CULL_MODE_BACK_BIT,				"back_"		},
			{ VK_CULL_MODE_FRONT_AND_BACK,			"both_"		},
		};
		static const struct PrimitiveType
		{
			VkPrimitiveTopology	type;
			const char*			name;
		} primitiveTypes[] =
		{
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,			"triangles"			},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,			"triangle_strip"	},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,			"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			VkFrontFace	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ VK_FRONT_FACE_COUNTER_CLOCKWISE,	""			},
			{ VK_FRONT_FACE_CLOCKWISE,			"_reverse"	},
		};

		static const struct PolygonMode
		{
			VkPolygonMode	mode;
			const char*		name;
		} polygonModes[] =
		{
			{ VK_POLYGON_MODE_FILL,		""		},
			{ VK_POLYGON_MODE_LINE,		"_line"		},
			{ VK_POLYGON_MODE_POINT,	"_point"	}
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(testCtx, "culling", "Culling");

		rasterizationTests->addChild(culling);

		for (int cullModeNdx	= 0; cullModeNdx	< DE_LENGTH_OF_ARRAY(cullModes);		++cullModeNdx)
		for (int primitiveNdx	= 0; primitiveNdx	< DE_LENGTH_OF_ARRAY(primitiveTypes);	++primitiveNdx)
		for (int frontOrderNdx	= 0; frontOrderNdx	< DE_LENGTH_OF_ARRAY(frontOrders);		++frontOrderNdx)
		for (int polygonModeNdx = 0; polygonModeNdx	< DE_LENGTH_OF_ARRAY(polygonModes);		++polygonModeNdx)
		{
			if (!(cullModes[cullModeNdx].mode == VK_CULL_MODE_FRONT_AND_BACK && polygonModes[polygonModeNdx].mode != VK_POLYGON_MODE_FILL))
			{
				const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix + polygonModes[polygonModeNdx].name;
				culling->addChild(new CullingTestCase(testCtx, name, "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode, polygonModes[polygonModeNdx].mode));
			}
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(testCtx, "interpolation", "Test interpolation");

		rasterizationTests->addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_strip",	"Verify triangle strip interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_fan",	"Verify triangle fan interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "line_strip",		"Verify line strip interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "line_strip_wide","Verify wide line strip interpolation",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangle_strip",	"Verify triangle strip interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangle_fan",	"Verify triangle fan interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "line_strip",		"Verify line strip interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "line_strip_wide","Verify wide line strip interpolation",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
		}
	}

	// .flatshading
	{
		tcu::TestCaseGroup* const flatshading = new tcu::TestCaseGroup(testCtx, "flatshading", "Test flatshading");

		rasterizationTests->addChild(flatshading);

		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle flatshading",			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_strip",	"Verify triangle strip flatshading",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_fan",	"Verify triangle fan flatshading",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line flatshading",				VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "line_strip",		"Verify line strip flatshading",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line flatshading",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "line_strip_wide","Verify wide line strip flatshading",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
	}

	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT
	};

	for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); samplesNdx++)
	{
		std::ostringstream caseName;

		caseName << "_multisample_" << (2 << samplesNdx) << "_bit";

		// .primitives
		{
			tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(testCtx, ("primitives" + caseName.str()).c_str(), "Primitive rasterization");

			rasterizationTests->addChild(primitives);

			primitives->addChild(new BaseTestCase<TrianglesTestInstance>		(testCtx, "triangles",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result",					samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",						PRIMITIVEWIDENESS_NARROW,	samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines_wide",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<PointTestInstance>		(testCtx, "points",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",						PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
		}

		// .fill_rules
		{
			tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(testCtx, ("fill_rules" + caseName.str()).c_str(), "Primitive fill rules");

			rasterizationTests->addChild(fillRules);

			fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_BASIC,			samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad_reverse",	"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_REVERSED,		samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_full",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_FULL,	samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_partly",		"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_PARTIAL,	samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"projected",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_PROJECTED,		samples[samplesNdx]));
		}

		// .interpolation
		{
			tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(testCtx, ("interpolation" + caseName.str()).c_str(), "Test interpolation");

			rasterizationTests->addChild(interpolation);

			interpolation->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_NONE,								samples[samplesNdx]));
			interpolation->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW,	samples[samplesNdx]));
			interpolation->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
		}
	}
}